

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O3

void __thiscall
CircularArrayTest_const_at_Test::~CircularArrayTest_const_at_Test
          (CircularArrayTest_const_at_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(CircularArrayTest, const_at) {
  CircularArray<TestObject, 2> ca;
  const auto& cca = ca;

  ca.push_back(TestObject(1));
  ca.push_back(TestObject(2));

  ASSERT_EQ(1, cca.at(0).data);
  ASSERT_EQ(2, cca.at(1).data);
}